

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_fcmlah_idx_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  float16 fVar4;
  float16 fVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar1 = (desc & 0x1f) * 8 + 8;
  uVar9 = (ulong)uVar1;
  uVar8 = desc >> 10 & 1;
  uVar10 = desc >> 0xb & 1;
  uVar11 = 0;
  while (uVar11 < uVar1 >> 1) {
    uVar6 = uVar11 | desc >> 0xb & 6;
    uVar2 = *(ushort *)((long)vm + uVar6 * 2);
    uVar3 = *(ushort *)((long)vm + uVar6 * 2 + 2);
    uVar7 = uVar2;
    if (uVar8 == 0) {
      uVar7 = uVar3;
      uVar3 = uVar2;
    }
    uVar6 = uVar11 + 8;
    for (uVar12 = uVar11; uVar11 = uVar6, uVar12 < uVar6; uVar12 = uVar12 + 2) {
      fVar5 = *(float16 *)((long)vn + uVar12 * 2 + (ulong)uVar8 * 2);
      fVar4 = float16_muladd_arm(fVar5,uVar3 ^ (ushort)((uVar8 ^ uVar10) << 0xf),
                                 *(float16 *)((long)vd + uVar12 * 2),0,(float_status *)vfpst);
      *(float16 *)((long)vd + uVar12 * 2) = fVar4;
      fVar5 = float16_muladd_arm(fVar5,uVar7 ^ (ushort)(uVar10 << 0xf),
                                 *(float16 *)((long)vd + uVar12 * 2 + 2),0,(float_status *)vfpst);
      *(float16 *)((long)vd + uVar12 * 2 + 2) = fVar5;
    }
  }
  for (; uVar9 < (desc >> 2 & 0xf8) + 8; uVar9 = uVar9 + 8) {
    *(undefined8 *)((long)vd + uVar9) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_fcmlah_idx)(void *vd, void *vn, void *vm,
                             void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float16 *d = vd;
    float16 *n = vn;
    float16 *m = vm;
    float_status *fpst = vfpst;
    intptr_t flip = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    intptr_t index = extract32(desc, SIMD_DATA_SHIFT + 2, 2);
    uint32_t neg_real = flip ^ neg_imag;
    intptr_t elements = opr_sz / sizeof(float16);
    intptr_t eltspersegment = 16 / sizeof(float16);
    intptr_t i, j;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 15;
    neg_imag <<= 15;

    for (i = 0; i < elements; i += eltspersegment) {
        float16 mr = m[H2(i + 2 * index + 0)];
        float16 mi = m[H2(i + 2 * index + 1)];
        float16 e1 = neg_real ^ (flip ? mi : mr);
        float16 e3 = neg_imag ^ (flip ? mr : mi);

        for (j = i; j < i + eltspersegment; j += 2) {
            float16 e2 = n[H2(j + flip)];
            float16 e4 = e2;

            d[H2(j)] = float16_muladd(e2, e1, d[H2(j)], 0, fpst);
            d[H2(j + 1)] = float16_muladd(e4, e3, d[H2(j + 1)], 0, fpst);
        }
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}